

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

ssize_t __thiscall
booster::aio::stream_socket::write(stream_socket *this,int __fd,void *__buf,size_t __n)

{
  size_t n;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  const_buffer tmp;
  buffer_impl<const_char_*> local_50;
  
  buffer_impl<const_char_*>::buffer_impl
            (&local_50,(buffer_impl<const_char_*> *)CONCAT44(in_register_00000034,__fd));
  sVar1 = 0;
  while (local_50.size_ != 0) {
    n = write_some(this,(const_buffer *)&local_50,(error_code *)__buf);
    sVar1 = sVar1 + n;
    if (*__buf != 0) break;
    operator+=((const_buffer *)&local_50,n);
  }
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(&local_50.vec_.
                   super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 );
  return sVar1;
}

Assistant:

size_t stream_socket::write(const_buffer const &buffer,system::error_code &e)
{
	const_buffer tmp = buffer;
	size_t count = 0;
	while(!tmp.empty()) {
		size_t n = write_some(tmp,e);
		count+=n;
		if(e) return count;
		tmp+=n;
	}
	return count;
}